

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shufflechannel.cpp
# Opt level: O2

int __thiscall ncnn::ShuffleChannel::forward(ShuffleChannel *this,Mat *bottom_blob,Mat *top_blob)

{
  int _w;
  int _h;
  size_t _elemsize;
  void *__dest;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Mat local_90;
  Mat local_60;
  
  iVar2 = bottom_blob->c;
  iVar1 = iVar2 / this->group;
  iVar3 = -100;
  if (iVar2 == this->group * iVar1) {
    _w = bottom_blob->w;
    _h = bottom_blob->h;
    _elemsize = bottom_blob->elemsize;
    Mat::create(top_blob,_w,_h,iVar2,_elemsize);
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar2 = 0;
      for (iVar3 = 0; iVar3 != this->group; iVar3 = iVar3 + 1) {
        for (iVar4 = 0; iVar1 != iVar4; iVar4 = iVar4 + 1) {
          Mat::channel(&local_90,top_blob,this->group * iVar4 + iVar3);
          __dest = local_90.data;
          Mat::channel(&local_60,bottom_blob,iVar2 + iVar4);
          memcpy(__dest,local_60.data,_elemsize * (long)(_h * _w));
          Mat::~Mat(&local_60);
          Mat::~Mat(&local_90);
        }
        iVar2 = iVar2 + iVar1;
      }
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int ShuffleChannel::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int c = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int chs_per_group = c / group;

    if (c != chs_per_group * group)
    {
        // reject invalid group
        return -100;
    }

    top_blob.create(w, h, c, elemsize);
    if (top_blob.empty())
        return -100;

    const size_t feature_sz = w * h * elemsize;
    for (int i = 0; i != group; i++)
    {
        for (int j = 0; j != chs_per_group; j++)
        {
            int src_q = chs_per_group * i + j;
            int dst_q = group * j + i;
            memcpy(top_blob.channel(dst_q), bottom_blob.channel(src_q), feature_sz);
        }
    }
    return 0;
}